

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

void __thiscall
libDAI::FactorGraph::FactorGraph
          (FactorGraph *this,
          vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  pointer pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Var *this_00;
  reference n;
  GraphicalModel *in_RDI;
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  iVar5;
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  iVar6;
  size_t i1;
  const_iterator q;
  VarSet ns;
  size_t i2;
  const_iterator p1;
  const_iterator p2;
  set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> _vars;
  VarSet *in_stack_fffffffffffffe18;
  iterator in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffffe30;
  set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *in_stack_fffffffffffffe48;
  _Iter in_stack_fffffffffffffe50;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_fffffffffffffe60;
  pair<unsigned_long,_unsigned_long> local_110;
  unsigned_long local_100;
  Var *local_f8;
  Var *local_f0;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_e8 [5];
  unsigned_long local_c0;
  _Base_ptr local_b8;
  _Self local_b0;
  _Self local_a8;
  TFactor<double> *local_a0;
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  local_98;
  _Base_ptr local_88;
  insert_iterator<std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>_>
  local_80;
  Var *local_70;
  Var *local_68;
  TFactor<double> *local_60;
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_58 [11];
  undefined4 extraout_var_02;
  
  GraphicalModel::GraphicalModel(in_RDI);
  in_RDI->_vptr_GraphicalModel = (_func_int **)&PTR__FactorGraph_00d4d790;
  BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::BipartiteGraph
            ((BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *)
             in_stack_fffffffffffffe20._M_node);
  memset(in_RDI + 10,0,0x30);
  std::
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  ::map((map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
         *)0xb39af5);
  std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>::set
            ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)0xb39b02);
  local_58[0]._M_current =
       (TFactor<double> *)
       std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                 ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                  in_stack_fffffffffffffe18);
  while( true ) {
    local_60 = (TFactor<double> *)
               std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                         ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           *)in_stack_fffffffffffffe18);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_fffffffffffffe20._M_node,
                       (__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_fffffffffffffe18);
    if (!bVar2) break;
    BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::V2s
              ((BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *)(in_RDI + 1));
    __gnu_cxx::
    __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator*(local_58);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (in_stack_fffffffffffffe30,
               (value_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
             ::operator->(local_58);
    TFactor<double>::vars(pTVar4);
    local_68 = (Var *)VarSet::begin(in_stack_fffffffffffffe18);
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
             ::operator->(local_58);
    TFactor<double>::vars(pTVar4);
    local_70 = (Var *)VarSet::end(in_stack_fffffffffffffe18);
    local_88 = (_Base_ptr)
               std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>::begin
                         ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
                          in_stack_fffffffffffffe18);
    iVar5 = std::inserter<std::set<libDAI::Var,std::less<libDAI::Var>,std::allocator<libDAI::Var>>>
                      ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
                       in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
    iVar6.iter._M_node = in_stack_fffffffffffffe50._M_node;
    iVar6.container = in_stack_fffffffffffffe48;
    local_80 = iVar5;
    iVar6 = std::
            copy<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,std::insert_iterator<std::set<libDAI::Var,std::less<libDAI::Var>,std::allocator<libDAI::Var>>>>
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,iVar6);
    local_98 = iVar6;
    local_a0 = (TFactor<double> *)
               __gnu_cxx::
               __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator++((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (int)((ulong)in_stack_fffffffffffffe20._M_node >> 0x20));
  }
  local_a8._M_node =
       (_Base_ptr)
       std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>::begin
                 ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
                  in_stack_fffffffffffffe18);
  while( true ) {
    local_b0._M_node =
         (_Base_ptr)
         std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>::end
                   ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)
                    in_stack_fffffffffffffe18);
    bVar2 = std::operator!=(&local_a8,&local_b0);
    if (!bVar2) break;
    BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::V1s
              ((BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *)(in_RDI + 1));
    std::_Rb_tree_const_iterator<libDAI::Var>::operator*
              ((_Rb_tree_const_iterator<libDAI::Var> *)0xb39d71);
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back
              ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_fffffffffffffe30,
               (value_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    local_b8 = (_Base_ptr)
               std::_Rb_tree_const_iterator<libDAI::Var>::operator++
                         ((_Rb_tree_const_iterator<libDAI::Var> *)
                          CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                          (int)((ulong)in_stack_fffffffffffffe20._M_node >> 0x20));
  }
  local_c0 = 0;
  do {
    uVar1 = local_c0;
    iVar3 = (*in_RDI->_vptr_GraphicalModel[9])();
    if (CONCAT44(extraout_var,iVar3) <= uVar1) {
      Regenerate((FactorGraph *)0xb3a006);
      std::set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_>::~set
                ((set<libDAI::Var,_std::less<libDAI::Var>,_std::allocator<libDAI::Var>_> *)0xb3a015)
      ;
      return;
    }
    iVar3 = (*in_RDI->_vptr_GraphicalModel[10])(in_RDI,local_c0);
    TFactor<double>::vars((TFactor<double> *)CONCAT44(extraout_var_00,iVar3));
    VarSet::VarSet((VarSet *)in_stack_fffffffffffffe20._M_node,in_stack_fffffffffffffe18);
    local_f0 = (Var *)VarSet::begin(in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
    __normal_iterator<libDAI::Var*>
              ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                *)in_stack_fffffffffffffe20._M_node,
               (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                *)in_stack_fffffffffffffe18);
    while( true ) {
      local_f8 = (Var *)VarSet::end(in_stack_fffffffffffffe18);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_fffffffffffffe20._M_node,
                         (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                          *)in_stack_fffffffffffffe18);
      if (!bVar2) break;
      local_100 = 0;
      while( true ) {
        uVar1 = local_100;
        iVar3 = (*in_RDI->_vptr_GraphicalModel[5])();
        if (CONCAT44(extraout_var_01,iVar3) <= uVar1) break;
        iVar3 = (*in_RDI->_vptr_GraphicalModel[6])(in_RDI,local_100);
        this_00 = (Var *)CONCAT44(extraout_var_02,iVar3);
        n = __gnu_cxx::
            __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
            ::operator*(local_e8);
        in_stack_fffffffffffffe2f = Var::operator==(this_00,n);
        if ((bool)in_stack_fffffffffffffe2f) {
          in_stack_fffffffffffffe20._M_node =
               (_Base_ptr)
               BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::edges
                         ((BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *)(in_RDI + 1));
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_110,&local_100,&local_c0);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffe20._M_node,(value_type *)in_stack_fffffffffffffe18);
          break;
        }
        local_100 = local_100 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
      ::operator++((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   (int)((ulong)in_stack_fffffffffffffe20._M_node >> 0x20));
    }
    VarSet::~VarSet((VarSet *)0xb39fe0);
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

FactorGraph::FactorGraph( const std::vector<Factor> &P ) : GraphicalModel(), _fg(), _backupFactors() {
        // add Factors
        set<Var> _vars;
        for(vector<Factor>::const_iterator p2 = P.begin(); p2 != P.end(); p2++ ) {
            _fg.V2s().push_back(*p2);
            copy( p2->vars().begin(), p2->vars().end(), inserter( _vars, _vars.begin() ) );
        }

        // add _vars
        for(set<Var>::const_iterator p1 = _vars.begin(); p1 != _vars.end(); p1++ )
            _fg.V1s().push_back(*p1);

        // create edges
        for(size_t i2 = 0; i2 < nrFactors(); i2++ ) {
            VarSet ns = factor(i2).vars();
            for(VarSet::const_iterator q = ns.begin(); q != ns.end(); q++ ) {
                for(size_t i1=0; i1 < nrVars(); i1++ ) {
                    if (var(i1) == *q) {
                        _fg.edges().push_back(edge_type(i1,i2));
                        break;
                    }
                }
            }
        }

        // calc neighbours and adjacency matrix
        Regenerate();
    }